

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *__return_storage_ptr__,string *s,char delimiter)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_68;
  char ch;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  iterator it;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string temp;
  char delimiter_local;
  string *s_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rtv;
  
  temp.field_2._M_local_buf[0xe] = '\0';
  temp.field_2._M_local_buf[0xf] = delimiter;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"",&local_41);
  std::allocator<char>::~allocator(&local_41);
  local_60._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    _Stack_68._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator==(&local_60,&stack0xffffffffffffff98);
    if (bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_60);
    if (*pcVar2 == temp.field_2._M_local_buf[0xf]) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_40);
      std::__cxx11::string::operator=((string *)local_40,"");
    }
    else {
      std::__cxx11::string::operator+=((string *)local_40,*pcVar2);
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_60);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_40);
  temp.field_2._M_local_buf[0xe] = '\x01';
  std::__cxx11::string::~string((string *)local_40);
  if ((temp.field_2._M_local_buf[0xe] & 1U) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> split(std::string s, char delimiter) {
    std::vector<std::string> rtv;
    std::string temp = "";
    for (auto it = s.begin(); true; ++it) {
        if (it == s.end()) {
            rtv.push_back(std::move(temp));
            return rtv;
        }
        char ch = *it;
        if (ch == delimiter) {
            rtv.push_back(std::move(temp));
            temp = "";
        }
        else {
            temp += ch;
        }
    }
}